

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O2

map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
* Dashel::SerialPortEnumerator::getPorts_abi_cxx11_(void)

{
  _Rb_tree_header *p_Var1;
  __dev_t __dev;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  undefined8 uVar8;
  long lVar9;
  char *pcVar10;
  ostream *poVar11;
  mapped_type *this;
  DashelException *pDVar12;
  map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_RDI;
  int iVar13;
  allocator<char> local_2d9;
  map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_2d8;
  int local_2cc;
  char *local_2c8;
  undefined8 local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278;
  stat st;
  ostringstream oss;
  
  p_Var1 = &(in_RDI->_M_t)._M_impl.super__Rb_tree_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2d8 = in_RDI;
  lVar5 = udev_new();
  if (lVar5 == 0) {
    pDVar12 = (DashelException *)__cxa_allocate_exception(0x20);
    DashelException::DashelException
              (pDVar12,EnumerationError,0,"Cannot create udev context",(Stream *)0x0);
    __cxa_throw(pDVar12,&DashelException::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar6 = udev_enumerate_new(lVar5);
  udev_enumerate_add_match_subsystem(uVar6,"tty");
  udev_enumerate_scan_devices(uVar6);
  lVar7 = udev_enumerate_get_list_entry(uVar6);
  iVar13 = 0;
  while( true ) {
    if (lVar7 == 0) {
      udev_enumerate_unref(uVar6);
      udev_unref(lVar5);
      return local_2d8;
    }
    uVar8 = udev_list_entry_get_name(lVar7);
    uVar8 = udev_device_new_from_syspath(lVar5,uVar8);
    local_2c8 = (char *)udev_device_get_devnode(uVar8);
    local_2c0 = uVar8;
    iVar2 = stat(local_2c8,(stat *)&st);
    __dev = st.st_rdev;
    if (iVar2 != 0) break;
    if ((st.st_mode & 0xf000) != 0x2000) {
      pDVar12 = (DashelException *)__cxa_allocate_exception(0x20);
      DashelException::DashelException
                (pDVar12,EnumerationError,0,"Serial port is not character device",(Stream *)0x0);
      goto LAB_00115cb2;
    }
    uVar3 = gnu_dev_major(st.st_rdev);
    if ((((uVar3 != 2) && (uVar4 = gnu_dev_minor(__dev), uVar3 != 4 || 0x3f < uVar4)) &&
        (uVar3 != 3)) && (uVar3 != 5)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      lVar9 = udev_device_get_parent_with_subsystem_devtype(local_2c0,"usb","usb_device");
      if (lVar9 == 0) {
        std::operator<<((ostream *)&oss,"Serial Port");
      }
      else {
        pcVar10 = (char *)udev_device_get_sysattr_value(lVar9,"product");
        std::operator<<((ostream *)&oss,pcVar10);
      }
      poVar11 = std::operator<<((ostream *)&oss," (");
      poVar11 = std::operator<<(poVar11,local_2c8);
      std::operator<<(poVar11,")");
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,local_2c8,&local_2d9);
      std::__cxx11::stringbuf::str();
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_278,&local_298,&local_2b8);
      local_2cc = iVar13;
      this = std::
             map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[](local_2d8,&local_2cc);
      iVar13 = iVar13 + 1;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=(this,&local_278);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_278);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    }
    udev_device_unref(local_2c0);
    lVar7 = udev_list_entry_get_next(lVar7);
  }
  pDVar12 = (DashelException *)__cxa_allocate_exception(0x20);
  DashelException::DashelException
            (pDVar12,EnumerationError,0,"Cannot stat serial port",(Stream *)0x0);
LAB_00115cb2:
  __cxa_throw(pDVar12,&DashelException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual bool isDataInRecvBuffer() const { return false; }